

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O3

void __thiscall
duckdb::ChunkVectorInfo::CommitAppend
          (ChunkVectorInfo *this,transaction_t commit_id,idx_t start,idx_t end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (this->same_inserted_id == true) {
    this->insert_id = commit_id;
  }
  auVar2 = _DAT_01d9fb10;
  auVar1 = _DAT_01d9fb00;
  lVar3 = end - start;
  if (start <= end && lVar3 != 0) {
    lVar4 = lVar3 + -1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_01d9fb10;
    do {
      auVar7._8_4_ = (int)uVar5;
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = (int)(uVar5 >> 0x20);
      auVar7 = (auVar7 | auVar1) ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar7._0_4_ ||
                  auVar6._4_4_ < auVar7._4_4_) & 1)) {
        this->inserted[start + uVar5] = commit_id;
      }
      if ((auVar7._12_4_ != auVar6._12_4_ || auVar7._8_4_ <= auVar6._8_4_) &&
          auVar7._12_4_ <= auVar6._12_4_) {
        this->inserted[start + uVar5 + 1] = commit_id;
      }
      uVar5 = uVar5 + 2;
    } while ((lVar3 + 1U & 0xfffffffffffffffe) != uVar5);
  }
  return;
}

Assistant:

void ChunkVectorInfo::CommitAppend(transaction_t commit_id, idx_t start, idx_t end) {
	if (same_inserted_id) {
		insert_id = commit_id;
	}
	for (idx_t i = start; i < end; i++) {
		inserted[i] = commit_id;
	}
}